

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O1

string * __thiscall
t_json_generator::escape_json_string
          (string *__return_storage_ptr__,t_json_generator *this,string *input)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  string *psVar4;
  size_type sVar5;
  char *pcVar6;
  ostringstream ss;
  byte local_1b1;
  string *local_1b0;
  undefined1 local_1a8 [376];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  sVar2 = input->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (input->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      bVar1 = pcVar3[sVar5];
      if (0x21 < bVar1) {
        pcVar6 = "\\\"";
        if (bVar1 != 0x22) {
          if (bVar1 == 0x2f) {
            pcVar6 = "\\/";
          }
          else {
            if (bVar1 != 0x5c) goto switchD_002a5a3e_caseD_b;
            pcVar6 = "\\\\";
          }
        }
        goto LAB_002a5a8f;
      }
      switch(bVar1) {
      case 8:
        pcVar6 = "\\b";
        break;
      case 9:
        pcVar6 = "\\t";
        break;
      case 10:
        pcVar6 = "\\n";
        break;
      default:
switchD_002a5a3e_caseD_b:
        local_1b1 = bVar1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1b1,1);
        goto LAB_002a5a9c;
      case 0xc:
        pcVar6 = "\\f";
        break;
      case 0xd:
        pcVar6 = "\\r";
      }
LAB_002a5a8f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,2);
LAB_002a5a9c:
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  psVar4 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar4;
}

Assistant:

string t_json_generator::escape_json_string(const string& input) {
  std::ostringstream ss;
  for (char iter : input) {
    switch (iter) {
    case '\\':
      ss << "\\\\";
      break;
    case '"':
      ss << "\\\"";
      break;
    case '/':
      ss << "\\/";
      break;
    case '\b':
      ss << "\\b";
      break;
    case '\f':
      ss << "\\f";
      break;
    case '\n':
      ss << "\\n";
      break;
    case '\r':
      ss << "\\r";
      break;
    case '\t':
      ss << "\\t";
      break;
    default:
      ss << iter;
      break;
    }
  }
  return ss.str();
}